

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

void __thiscall Editor::editTile(Editor *this,bool toggleState)

{
  CursorState CVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  _Head_base<0UL,_Command_*,_false> _Var7;
  tuple<Command_*,_std::default_delete<Command>_> tVar8;
  int iVar9;
  uint uVar10;
  int i;
  ulong uVar11;
  int iVar12;
  SubBoard *this_00;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar13;
  Tile tile;
  undefined1 local_b0 [8];
  undefined1 local_a8 [24];
  Tile local_90;
  uint local_78;
  int local_74;
  uint local_70;
  int local_6c;
  uint local_68;
  int local_64;
  unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_> local_60;
  _Head_base<0UL,_gui::Theme_*,_false> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  CVar1 = this->cursorState_;
  if ((int)CONCAT71(in_register_00000031,toggleState) != 0) {
    switch(CVar1) {
    case empty:
      if ((this->cursorCoords_).second != true) {
        return;
      }
      pVar13 = Board::getHighlightedBounds(this->board_);
      iVar5 = pVar13.first.x;
      iVar9 = pVar13.second.x;
      if (iVar5 <= iVar9) {
        local_a8[0] = 1;
        makeCommand<commands::ToggleTiles,Board&,bool>
                  ((Editor *)local_b0,(Board *)this,(bool *)this->board_);
        local_58._M_head_impl = (Theme *)this->board_;
        local_38._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)pVar13.first >> 0x20);
        local_40._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)pVar13.second >> 0x20);
        local_74 = pVar13.second.y >> 5;
        local_78 = iVar5 >> 5;
        local_6c = iVar9 >> 5;
        uVar4 = pVar13.first.y >> 5;
        local_60._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
        super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
        super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl =
             (__uniq_ptr_data<gui::Gui,_std::default_delete<gui::Gui>,_true,_true>)
             (__uniq_ptr_data<gui::Gui,_std::default_delete<gui::Gui>,_true,_true>)this;
        while (auVar2 = local_b0, (int)uVar4 <= local_74) {
          local_50._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(uVar4 | 0x80000000) << 0x20)
          ;
          local_64 = uVar4 << 5;
          uVar6 = local_78;
          local_70 = uVar4;
          while ((int)uVar6 <= local_6c) {
            local_48._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 Board::accessChunk((Board *)local_58._M_head_impl,
                                    (ulong)(uVar6 | 0x80000000) | (ulong)local_50._M_pi);
            uVar11 = 0;
            local_68 = uVar6;
            while (uVar4 = (uint)uVar11, uVar4 != 0x400) {
              uVar10 = uVar4 & 0x1f | uVar6 << 5;
              if ((iVar5 <= (int)uVar10) && ((int)uVar10 <= iVar9)) {
                iVar12 = (int)(uVar11 >> 5) + local_64;
                if (((int)local_38._M_pi <= iVar12) && (iVar12 <= (int)local_40._M_pi)) {
                  Chunk::accessTile((Tile *)local_a8,(Chunk *)local_48._M_pi,uVar4);
                  bVar3 = Tile::getHighlight((Tile *)local_a8);
                  if (bVar3) {
                    local_90.tileType_ = (TileType *)CONCAT44(iVar12,uVar10);
                    commands::ToggleTiles::pushBackTile
                              ((ToggleTiles *)local_b0,(Vector2i *)&local_90);
                  }
                }
              }
              uVar11 = (ulong)(uVar4 + 1);
            }
            uVar6 = local_68 + 1;
          }
          uVar4 = local_70 + 1;
        }
        local_b0 = (undefined1  [8])0x0;
        local_a8._0_8_ = auVar2;
        executeCommand((Editor *)
                       local_60._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>
                       ._M_t.super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
                       super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl,
                       (unique_ptr<Command,_std::default_delete<Command>_> *)local_a8);
        _Var7._M_head_impl = (Command *)local_a8._0_8_;
        goto LAB_0013fcf2;
      }
      local_90.tileType_ = (TileType *)((ulong)local_90.tileType_ & 0xffffffffffffff00);
      makeCommand<commands::ToggleTiles,Board&,bool>
                ((Editor *)local_a8,(Board *)this,(bool *)this->board_);
      commands::ToggleTiles::pushBackTile
                ((ToggleTiles *)local_a8._0_8_,&(this->cursorCoords_).first);
      local_90.tileType_ = (TileType *)local_a8._0_8_;
      local_a8._0_8_ = (__uniq_ptr_impl<Command,_std::default_delete<Command>_>)0x0;
      executeCommand(this,(unique_ptr<Command,_std::default_delete<Command>_> *)&local_90);
      tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
      super__Head_base<0UL,_Command_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
           (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_a8._0_8_;
      if ((PlaceTiles *)local_90.tileType_ != (PlaceTiles *)0x0) {
        (*((Command *)&(local_90.tileType_)->_vptr_TileType)->_vptr_Command[1])();
        tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
        super__Head_base<0UL,_Command_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
             (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_a8._0_8_;
      }
      goto LAB_0013fd02;
    case pickTile:
      this_00 = &this->tileSubBoard_;
      break;
    case pasteArea:
      this_00 = &this->copySubBoard_;
      break;
    case wireTool:
      this->wireToolWireState_ = (this->wireToolWireState_ & low) + low;
      updateWireTool(this,&(this->cursorCoords_).first);
      return;
    default:
      goto switchD_0013f9c7_default;
    }
    SubBoard::toggleTileStates(this_00);
    return;
  }
  if (CVar1 == pickTile) {
    SubBoard::accessTile((Tile *)local_a8,&this->tileSubBoard_,0,0);
    Tile::alternativeTile((Tile *)local_a8);
    return;
  }
  if (CVar1 != empty) {
    return;
  }
  if ((this->cursorCoords_).second != true) {
    return;
  }
  pVar13 = Board::getHighlightedBounds(this->board_);
  if (pVar13.first.x <= pVar13.second.x) {
    return;
  }
  makeCommand<commands::EditTiles,Board&,TilePool&>
            ((Editor *)local_b0,(Board *)this,(TilePool *)this->board_);
  commands::PlaceTiles::pushBackTile
            ((Tile *)local_a8,(PlaceTiles *)local_b0,&(this->cursorCoords_).first);
  Board::accessTile(&local_90,this->board_,&(this->cursorCoords_).first);
  Tile::cloneTo(&local_90,(Tile *)local_a8);
  Tile::alternativeTile((Tile *)local_a8);
  local_90.tileType_ = (TileType *)local_b0;
  local_b0 = (undefined1  [8])0x0;
  executeCommand(this,(unique_ptr<Command,_std::default_delete<Command>_> *)&local_90);
  _Var7._M_head_impl = (Command *)local_90.tileType_;
LAB_0013fcf2:
  tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
  super__Head_base<0UL,_Command_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
       (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_b0;
  if ((tuple<Command_*,_std::default_delete<Command>_>)_Var7._M_head_impl !=
      (_Head_base<0UL,_Command_*,_false>)0x0) {
    (*((Command *)&(_Var7._M_head_impl)->_vptr_Command)->_vptr_Command[1])();
    tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
    super__Head_base<0UL,_Command_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
         (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_b0;
  }
LAB_0013fd02:
  if (tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
      super__Head_base<0UL,_Command_*,_false>._M_head_impl != (_Head_base<0UL,_Command_*,_false>)0x0
     ) {
    (**(code **)(*(long *)tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
                          super__Head_base<0UL,_Command_*,_false>._M_head_impl + 8))();
  }
switchD_0013f9c7_default:
  return;
}

Assistant:

void Editor::editTile(bool toggleState) {
    if (toggleState) {
        if (cursorState_ == CursorState::empty) {
            if (!cursorCoords_.second) {
                return;
            }
            auto bounds = board_.getHighlightedBounds();
            if (bounds.first.x > bounds.second.x) {
                // Not toggling a selection.
                auto command = makeCommand<commands::ToggleTiles>(board_, false);
                command->pushBackTile(cursorCoords_.first);
                executeCommand(std::move(command));
            } else {
                // Toggling a selection.
                auto command = makeCommand<commands::ToggleTiles>(board_, true);
                forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
                    Tile tile = chunk.accessTile(i);
                    if (tile.getHighlight()) {
                        command->pushBackTile({x, y});
                    }
                });
                executeCommand(std::move(command));
            }
        } else if (cursorState_ == CursorState::pickTile) {
            tileSubBoard_.toggleTileStates();
        } else if (cursorState_ == CursorState::pasteArea) {
            copySubBoard_.toggleTileStates();
        } else if (cursorState_ == CursorState::wireTool) {
            wireToolWireState_ = static_cast<State::t>((wireToolWireState_ % 2) + 1);
            updateWireTool(cursorCoords_.first);
        }
    } else {
        if (cursorState_ == CursorState::empty) {
            if (!cursorCoords_.second) {
                return;
            }
            auto bounds = board_.getHighlightedBounds();
            if (bounds.first.x > bounds.second.x) {
                // Not editing a selection.
                auto command = makeCommand<commands::EditTiles>(board_, tilePool_);
                Tile tile = command->pushBackTile(cursorCoords_.first);
                board_.accessTile(cursorCoords_.first).cloneTo(tile);
                tile.alternativeTile();
                executeCommand(std::move(command));
            }
        } else if (cursorState_ == CursorState::pickTile) {
            tileSubBoard_.accessTile(0, 0).alternativeTile();
        }
    }
}